

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  char *buf;
  int iVar1;
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr out_00;
  _xmlDoc *p_Var2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  xmlDocPtr pxVar6;
  _xmlDtd *p_Var7;
  _xmlDtd *p_Var8;
  int iVar9;
  xmlDocPtr cur_00;
  xmlNodePtr pxVar10;
  xmlChar *pxVar11;
  _xmlNode *p_Var12;
  int *piVar13;
  char *pcVar14;
  _xmlDtd *p_Var15;
  _xmlDtd *p_Var16;
  _xmlNs *cur_01;
  _xmlDtd *p_Var17;
  _xmlDtd *p_Var18;
  bool bVar19;
  _xmlDtd *local_68;
  _xmlDtd *local_58;
  _xmlDtd *local_50;
  xmlDocPtr local_40;
  
  iVar1 = ctxt->format;
  out = ctxt->buf;
  buf = ctxt->indent;
  local_40 = (xmlDocPtr)0x0;
  pxVar6 = (xmlDocPtr)cur;
LAB_001ae2f9:
  cur_00 = pxVar6;
  if (cur_00->type == XML_DOCUMENT_FRAG_NODE) goto code_r0x001ae304;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar13 = __xmlIndentTreeOutput(), *piVar13 != 0)) {
      iVar9 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar9 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar9 * ctxt->indent_size,buf);
    }
    xmlOutputBufferWrite(out,1,"<");
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
      xmlOutputBufferWriteString(out,pcVar14);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,cur_00->name);
    for (cur_01 = cur_00->oldNs; cur_01 != (xmlNsPtr)0x0; cur_01 = cur_01->next) {
      xmlNsDumpOutput(ctxt->buf,cur_01,ctxt);
    }
    iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"html");
    if (((iVar9 != 0) &&
        (lVar3._0_4_ = cur_00->compression, lVar3._4_4_ = cur_00->standalone, lVar3 == 0)) &&
       (cur_00->oldNs == (_xmlNs *)0x0)) {
      xmlOutputBufferWriteString(out," xmlns=\"http://www.w3.org/1999/xhtml\"");
    }
    p_Var17 = cur_00->extSubset;
    if (p_Var17 != (_xmlDtd *)0x0) {
      out_00 = ctxt->buf;
      p_Var2 = p_Var17->parent;
      local_50 = (_xmlDtd *)0x0;
      local_68 = (_xmlDtd *)0x0;
      local_58 = (_xmlDtd *)0x0;
      p_Var15 = (_xmlDtd *)0x0;
      do {
        p_Var16 = local_58;
        p_Var8 = local_50;
        if ((((p_Var17->notations != (void *)0x0) ||
             (iVar9 = xmlStrEqual(p_Var17->name,"id"), p_Var18 = p_Var17, p_Var7 = local_68,
             iVar9 == 0)) &&
            (((p_Var18 = p_Var15, p_Var17->notations != (void *)0x0 ||
              (iVar9 = xmlStrEqual(p_Var17->name,"name"), p_Var7 = p_Var17, iVar9 == 0)) &&
             ((p_Var17->notations != (void *)0x0 ||
              (iVar9 = xmlStrEqual(p_Var17->name,"lang"), p_Var7 = local_68, p_Var16 = p_Var17,
              iVar9 == 0)))))) &&
           (((p_Var17->notations == (void *)0x0 ||
             ((iVar9 = xmlStrEqual(p_Var17->name,"lang"), iVar9 == 0 ||
              (iVar9 = xmlStrEqual(*(xmlChar **)((long)p_Var17->notations + 0x18),"xml"),
              p_Var7 = local_68, p_Var16 = local_58, p_Var8 = p_Var17, iVar9 == 0)))) &&
            ((p_Var7 = local_68, p_Var16 = local_58, p_Var8 = local_50,
             p_Var17->notations == (void *)0x0 &&
             ((((p_Var17->children == (_xmlNode *)0x0 ||
                (pxVar11 = p_Var17->children->content, pxVar11 == (xmlChar *)0x0)) ||
               (*pxVar11 == '\0')) && (iVar9 = htmlIsBooleanAttr(p_Var17->name), iVar9 != 0))))))))
        {
          if (p_Var17->children != (xmlNodePtr)0x0) {
            xmlFreeNode(p_Var17->children);
          }
          pxVar10 = xmlNewText(p_Var17->name);
          p_Var17->children = pxVar10;
          if (pxVar10 != (xmlNodePtr)0x0) {
            pxVar10->parent = (_xmlNode *)p_Var17;
          }
        }
        local_50 = p_Var8;
        local_58 = p_Var16;
        local_68 = p_Var7;
        xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var17);
        p_Var17 = (_xmlDtd *)p_Var17->next;
        p_Var15 = p_Var18;
      } while (p_Var17 != (_xmlDtd *)0x0);
      if ((((local_68 != (_xmlDtd *)0x0) && (p_Var18 == (_xmlDtd *)0x0)) &&
          ((p_Var2 != (_xmlDoc *)0x0 && ((xmlChar *)p_Var2->name != (xmlChar *)0x0)))) &&
         (((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"a"), iVar9 != 0 ||
           (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"p"), iVar9 != 0)) ||
          ((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"div"), iVar9 != 0 ||
           ((((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"img"), iVar9 != 0 ||
              (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"map"), iVar9 != 0)) ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"applet"), iVar9 != 0)) ||
            (((iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"form"), iVar9 != 0 ||
              (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,"frame"), iVar9 != 0)) ||
             (iVar9 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"iframe"), iVar9 != 0))))))))))
      {
        xmlOutputBufferWrite(out_00,5," id=\"");
        xmlAttrSerializeContent(out_00,(xmlAttrPtr)local_68);
        xmlOutputBufferWrite(out_00,1,"\"");
      }
      if (local_50 == (_xmlDtd *)0x0 && local_58 != (_xmlDtd *)0x0) {
        xmlOutputBufferWrite(out_00,0xb," xml:lang=\"");
      }
      else {
        if (local_58 != (_xmlDtd *)0x0 || local_50 == (_xmlDtd *)0x0) goto LAB_001ae9da;
        xmlOutputBufferWrite(out_00,7," lang=\"");
        local_58 = local_50;
      }
      xmlAttrSerializeContent(out_00,(xmlAttrPtr)local_58);
      xmlOutputBufferWrite(out_00,1,"\"");
    }
LAB_001ae9da:
    bVar4 = 1;
    if (((cur_00->parent == (_xmlNode *)0x0) || ((_xmlDoc *)cur_00->parent->parent != cur_00->doc))
       || ((iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"head"), iVar9 == 0 ||
           (iVar9 = xmlStrEqual(cur_00->parent->name,"html"), iVar9 == 0)))) {
      bVar5 = false;
    }
    else {
      p_Var12 = cur_00->children;
      bVar5 = true;
      if (p_Var12 == (_xmlNode *)0x0) {
        bVar4 = 0;
        bVar5 = true;
      }
      else {
        do {
          iVar9 = xmlStrEqual(p_Var12->name,(xmlChar *)"meta");
          if ((iVar9 != 0) &&
             (pxVar11 = xmlGetProp(p_Var12,(xmlChar *)"http-equiv"), pxVar11 != (xmlChar *)0x0)) {
            iVar9 = xmlStrcasecmp(pxVar11,(xmlChar *)"Content-Type");
            (*xmlFree)(pxVar11);
            if (iVar9 == 0) {
              bVar5 = false;
              bVar4 = 1;
              goto LAB_001ae9fc;
            }
          }
          p_Var12 = p_Var12->next;
        } while (p_Var12 != (_xmlNode *)0x0);
        bVar4 = 0;
      }
    }
LAB_001ae9fc:
    if (cur_00->children == (_xmlNode *)0x0) {
      lVar3 = *(long *)&cur_00->compression;
      if ((lVar3 != 0) && (*(long *)(lVar3 + 0x18) != 0)) goto LAB_001aeb00;
      if (((cur_00 == (xmlDocPtr)0x0) || (cur_00->type != XML_ELEMENT_NODE)) ||
         (((lVar3 != 0 &&
           (iVar9 = xmlStrEqual(*(xmlChar **)(lVar3 + 0x10),
                                (xmlChar *)"http://www.w3.org/1999/xhtml"), iVar9 == 0)) ||
          (cur_00->children != (_xmlNode *)0x0)))) {
        bVar19 = false;
        goto switchD_001aeea9_caseD_64;
      }
      pxVar11 = (xmlChar *)cur_00->name;
      bVar19 = false;
      switch(*pxVar11) {
      case 'a':
        pcVar14 = "area";
        break;
      case 'b':
        iVar9 = xmlStrEqual(pxVar11,"br");
        bVar19 = true;
        if ((iVar9 == 0) && (iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"base"), iVar9 == 0)) {
          pxVar11 = (xmlChar *)cur_00->name;
          pcVar14 = "basefont";
          break;
        }
        goto switchD_001aeea9_caseD_64;
      case 'c':
        pcVar14 = "col";
        break;
      default:
        goto switchD_001aeea9_caseD_64;
      case 'f':
        pcVar14 = "frame";
        break;
      case 'h':
        pcVar14 = "hr";
        break;
      case 'i':
        iVar9 = xmlStrEqual(pxVar11,(xmlChar *)"img");
        bVar19 = true;
        if ((iVar9 == 0) && (iVar9 = xmlStrEqual((xmlChar *)cur_00->name,"input"), iVar9 == 0)) {
          pxVar11 = (xmlChar *)cur_00->name;
          pcVar14 = "isindex";
          break;
        }
        goto switchD_001aeea9_caseD_64;
      case 'l':
        pcVar14 = "link";
        break;
      case 'm':
        pcVar14 = "meta";
        break;
      case 'p':
        pcVar14 = "param";
      }
      iVar9 = xmlStrEqual(pxVar11,(xmlChar *)pcVar14);
      bVar19 = iVar9 != 0;
switchD_001aeea9_caseD_64:
      if ((bool)(bVar4 & bVar19)) {
        iVar9 = 3;
        pcVar14 = " />";
      }
      else {
LAB_001aeb00:
        xmlOutputBufferWrite(out,1,">");
        if (bVar5) {
          if (ctxt->format == 1) {
            xmlOutputBufferWrite(out,1,"\n");
            piVar13 = __xmlIndentTreeOutput();
            if (*piVar13 != 0) {
              iVar9 = ctxt->level + 1;
              if (ctxt->indent_nr <= ctxt->level) {
                iVar9 = ctxt->indent_nr;
              }
              xmlOutputBufferWrite(out,iVar9 * ctxt->indent_size,buf);
            }
          }
          xmlOutputBufferWriteString
                    (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
          if (ctxt->encoding == (xmlChar *)0x0) {
            xmlOutputBufferWrite(out,5,"UTF-8");
          }
          else {
            xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
          }
          xmlOutputBufferWrite(out,4,"\" />");
          if (ctxt->format == 1) {
            xmlOutputBufferWrite(out,1,"\n");
          }
        }
        xmlOutputBufferWrite(out,2,"</");
        if ((*(long *)&cur_00->compression != 0) &&
           (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
          xmlOutputBufferWriteString(out,pcVar14);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,cur_00->name);
        iVar9 = 1;
        pcVar14 = ">";
      }
      goto LAB_001aed68;
    }
    xmlOutputBufferWrite(out,1,">");
    if (bVar5) {
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(out,1,"\n");
        piVar13 = __xmlIndentTreeOutput();
        if (*piVar13 != 0) {
          iVar9 = ctxt->level + 1;
          if (ctxt->indent_nr <= ctxt->level) {
            iVar9 = ctxt->indent_nr;
          }
          xmlOutputBufferWrite(out,iVar9 * ctxt->indent_size,buf);
        }
      }
      xmlOutputBufferWriteString
                (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
      if (ctxt->encoding == (xmlChar *)0x0) {
        xmlOutputBufferWrite(out,5,"UTF-8");
      }
      else {
        xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
      }
      xmlOutputBufferWrite(out,4,"\" />");
    }
    if (ctxt->format == 1) {
      for (p_Var12 = cur_00->children; p_Var12 != (_xmlNode *)0x0; p_Var12 = p_Var12->next) {
        if ((p_Var12->type == XML_ENTITY_REF_NODE) || (p_Var12->type == XML_TEXT_NODE)) {
          ctxt->format = 0;
          local_40 = cur_00;
          break;
        }
      }
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar6 = (xmlDocPtr)cur_00->children;
    goto LAB_001ae2f9;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var17 = cur_00->intSubset;
    if (p_Var17 != (_xmlDtd *)0x0) {
      if ((xmlChar *)cur_00->name == "textnoenc") {
        xmlOutputBufferWriteString(out,(char *)p_Var17);
      }
      else {
        xmlOutputBufferWriteEscape(out,(xmlChar *)p_Var17,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    p_Var17 = cur_00->intSubset;
    if ((p_Var17 != (_xmlDtd *)0x0) && (p_Var15 = p_Var17, *(char *)&p_Var17->_private != '\0')) {
      do {
        p_Var16 = p_Var15;
        if (*(char *)&p_Var17->_private == ']') {
          if ((*(char *)((long)&p_Var17->_private + 1) == ']') &&
             (*(char *)((long)&p_Var17->_private + 2) == '>')) {
            p_Var16 = (_xmlDtd *)((long)&p_Var17->_private + 2);
            xmlOutputBufferWrite(out,9,"<![CDATA[");
            xmlOutputBufferWrite(out,(int)p_Var16 - (int)p_Var15,(char *)p_Var15);
            xmlOutputBufferWrite(out,3,"]]>");
            p_Var17 = p_Var16;
          }
        }
        else if (*(char *)&p_Var17->_private == '\0') goto LAB_001ae933;
        p_Var17 = (_xmlDtd *)((long)&p_Var17->_private + 1);
        p_Var15 = p_Var16;
      } while( true );
    }
    xmlOutputBufferWrite(out,0xc,"<![CDATA[]]>");
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,cur_00->name);
    iVar9 = 1;
    pcVar14 = ";";
    goto LAB_001aed68;
  case XML_PI_NODE:
    p_Var17 = cur_00->intSubset;
    xmlOutputBufferWrite(out,2,"<?");
    xmlOutputBufferWriteString(out,cur_00->name);
    if ((p_Var17 != (_xmlDtd *)0x0) && (cur_00->intSubset != (_xmlDtd *)0x0)) {
      xmlOutputBufferWrite(out,1," ");
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
    }
    iVar9 = 2;
    pcVar14 = "?>";
    goto LAB_001aed68;
  case XML_COMMENT_NODE:
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(out,4,"<!--");
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
      iVar9 = 3;
      pcVar14 = "-->";
      goto LAB_001aed68;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,cur_00);
    break;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(out->buffer,(xmlElementPtr)cur_00);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)cur_00);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)cur_00);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(ctxt->buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_001ae32b_caseD_6:
  while( true ) {
    if (cur_00 == (xmlDocPtr)cur) {
      return;
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    pxVar6 = (xmlDocPtr)cur_00->next;
    if ((xmlDocPtr)cur_00->next != (xmlDocPtr)0x0) break;
    cur_00 = (xmlDocPtr)cur_00->parent;
    if (cur_00 == (xmlDocPtr)0x0) {
      return;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar13 = __xmlIndentTreeOutput();
      if ((*piVar13 != 0) && (ctxt->format == 1)) {
        iVar9 = ctxt->indent_nr;
        if (ctxt->level < ctxt->indent_nr) {
          iVar9 = ctxt->level;
        }
        xmlOutputBufferWrite(out,iVar9 * ctxt->indent_size,buf);
      }
      xmlOutputBufferWrite(out,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
        xmlOutputBufferWriteString(out,pcVar14);
        xmlOutputBufferWrite(out,1,":");
      }
      xmlOutputBufferWriteString(out,cur_00->name);
      xmlOutputBufferWrite(out,1,">");
      if (cur_00 == local_40) {
        ctxt->format = iVar1;
        local_40 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_001ae2f9;
code_r0x001ae304:
  pxVar6 = (xmlDocPtr)cur_00->children;
  if ((xmlDocPtr)cur_00->children != (xmlDocPtr)0x0) goto LAB_001ae2f9;
  goto switchD_001ae32b_caseD_6;
LAB_001ae933:
  if (p_Var15 != p_Var17) {
    xmlOutputBufferWrite(out,9,"<![CDATA[");
    xmlOutputBufferWriteString(out,(char *)p_Var15);
    iVar9 = 3;
    pcVar14 = "]]>";
LAB_001aed68:
    xmlOutputBufferWrite(out,iVar9,pcVar14);
  }
  goto switchD_001ae32b_caseD_6;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((cur->parent != NULL) &&
                (cur->parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(cur->parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        xmlChar *httpequiv;

                        httpequiv = xmlGetProp(tmp, BAD_CAST"http-equiv");
                        if (httpequiv != NULL) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            if (xmlIndentTreeOutput)
                                xmlOutputBufferWrite(buf, ctxt->indent_size *
                                    (ctxt->level + 1 > ctxt->indent_nr ?
                                    ctxt->indent_nr : ctxt->level + 1),
                                    ctxt->indent);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        if (xmlIndentTreeOutput)
                            xmlOutputBufferWrite(buf, ctxt->indent_size *
                                (ctxt->level + 1 > ctxt->indent_nr ?
                                ctxt->indent_nr : ctxt->level + 1),
                                ctxt->indent);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
}